

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

bool __thiscall
CLI::App::_parse_positional
          (App *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,bool haltOnSubcommand)

{
  bool bVar1;
  int iVar2;
  reference pvVar3;
  size_type sVar4;
  size_t sVar5;
  pointer pOVar6;
  element_type *peVar7;
  App *this_00;
  reference pvVar8;
  ExtrasError *this_01;
  ulong uVar9;
  App *local_230;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1a8;
  App *local_190;
  App *parent_app;
  App *com;
  shared_ptr<CLI::App> *subc;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_> *__range2_1;
  string local_158;
  string local_138;
  undefined1 local_118 [8];
  string pos_1;
  Option_p *opt_1;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
  *__range2;
  string local_d0;
  int local_b0;
  string local_a0;
  undefined1 local_80 [8];
  string pos;
  Option_p *opt;
  iterator __end4;
  iterator __begin4;
  vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
  *__range4;
  size_t remreq;
  size_type arg_rem;
  string *positional;
  bool haltOnSubcommand_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  App *this_local;
  
  pvVar3 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::back(args);
  if ((this->positionals_at_end_ & 1U) != 0) {
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(args);
    sVar5 = _count_remaining_positionals(this,true);
    if (sVar4 <= sVar5) {
      __end4 = std::
               vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
               ::begin(&this->options_);
      opt = (Option_p *)
            std::
            vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
            ::end(&this->options_);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end4,(__normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
                                         *)&opt), bVar1) {
        pos.field_2._8_8_ =
             __gnu_cxx::
             __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
             ::operator*(&__end4);
        pOVar6 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                           ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
                            pos.field_2._8_8_);
        bVar1 = Option::get_positional(pOVar6);
        if ((bVar1) &&
           (pOVar6 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                               ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
                                pos.field_2._8_8_),
           ((pOVar6->super_OptionBase<CLI::Option>).required_ & 1U) != 0)) {
          pOVar6 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                             ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
                              pos.field_2._8_8_);
          sVar5 = Option::count(pOVar6);
          pOVar6 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                             ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
                              pos.field_2._8_8_);
          iVar2 = Option::get_items_expected_min(pOVar6);
          if ((int)sVar5 < iVar2) {
            if ((this->validate_positionals_ & 1U) == 0) {
LAB_0018f0e2:
              pOVar6 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                                 ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
                                  pos.field_2._8_8_);
              ::std::__cxx11::string::string((string *)&local_d0,(string *)pvVar3);
              Option::add_result(pOVar6,&local_d0);
              ::std::__cxx11::string::~string((string *)&local_d0);
              __range2 = (vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                          *)std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::get
                                      ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *
                                       )pos.field_2._8_8_);
              std::vector<CLI::Option_*,_std::allocator<CLI::Option_*>_>::push_back
                        (&this->parse_order_,(value_type *)&__range2);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::pop_back(args);
              return true;
            }
            ::std::__cxx11::string::string((string *)local_80,(string *)pvVar3);
            pOVar6 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                               ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
                                pos.field_2._8_8_);
            Option::_validate(&local_a0,pOVar6,(string *)local_80,0);
            ::std::__cxx11::string::operator=((string *)local_80,(string *)&local_a0);
            ::std::__cxx11::string::~string((string *)&local_a0);
            uVar9 = ::std::__cxx11::string::empty();
            if ((uVar9 & 1) == 0) {
              local_b0 = 3;
            }
            else {
              local_b0 = 0;
            }
            ::std::__cxx11::string::~string((string *)local_80);
            if (local_b0 == 0) goto LAB_0018f0e2;
          }
        }
        __gnu_cxx::
        __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
        ::operator++(&__end4);
      }
    }
  }
  __end2 = std::
           vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ::begin(&this->options_);
  opt_1 = (Option_p *)
          std::
          vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
          ::end(&this->options_);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
                                *)&opt_1);
    if (!bVar1) {
      __end2_1 = std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                 ::begin(&this->subcommands_);
      subc = (shared_ptr<CLI::App> *)
             std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>::
             end(&this->subcommands_);
      do {
        bVar1 = __gnu_cxx::operator!=
                          (&__end2_1,
                           (__normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
                            *)&subc);
        if (!bVar1) {
          if ((this->parent_ == (App *)0x0) || ((this->fallthrough_ & 1U) == 0)) {
            pvVar8 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::back(args);
            parent_app = _find_subcommand(this,pvVar8,true,false);
            if ((parent_app == (App *)0x0) ||
               ((this->require_subcommand_max_ != 0 &&
                (uVar9 = this->require_subcommand_max_,
                sVar4 = std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::size
                                  (&this->parsed_subcommands_), uVar9 <= sVar4)))) {
              local_230 = this;
              if (this->parent_ != (App *)0x0) {
                local_230 = _get_fallthrough_parent(this);
              }
              local_190 = local_230;
              pvVar8 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::back(args);
              parent_app = _find_subcommand(local_230,pvVar8,true,false);
              if ((parent_app == (App *)0x0) ||
                 ((parent_app->parent_->require_subcommand_max_ != 0 &&
                  (uVar9 = parent_app->parent_->require_subcommand_max_,
                  sVar4 = std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::size
                                    (&parent_app->parent_->parsed_subcommands_), uVar9 <= sVar4))))
              {
                if ((this->positionals_at_end_ & 1U) != 0) {
                  this_01 = (ExtrasError *)__cxa_allocate_exception(0x38);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::vector(&local_1a8,args);
                  ExtrasError::ExtrasError(this_01,&this->name_,&local_1a8);
                  __cxa_throw(this_01,&ExtrasError::typeinfo,ExtrasError::~ExtrasError);
                }
                if ((this->parent_ == (App *)0x0) ||
                   (uVar9 = ::std::__cxx11::string::empty(), (uVar9 & 1) == 0)) {
                  _move_to_missing(this,NONE,pvVar3);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::pop_back(args);
                  if ((this->prefix_command_ & 1U) != 0) {
                    while (bVar1 = std::
                                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ::empty(args), ((bVar1 ^ 0xffU) & 1) != 0) {
                      pvVar3 = std::
                               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ::back(args);
                      _move_to_missing(this,NONE,pvVar3);
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::pop_back(args);
                    }
                  }
                  this_local._7_1_ = true;
                }
                else {
                  this_local._7_1_ = false;
                }
              }
              else {
                this_local._7_1_ = false;
              }
            }
            else if (haltOnSubcommand) {
              this_local._7_1_ = false;
            }
            else {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::pop_back(args);
              _parse(parent_app,args);
              this_local._7_1_ = true;
            }
          }
          else {
            this_00 = _get_fallthrough_parent(this);
            bVar1 = ::std::function::operator_cast_to_bool
                              ((function *)&this->parse_complete_callback_);
            this_local._7_1_ = _parse_positional(this_00,args,bVar1);
          }
          return this_local._7_1_;
        }
        com = (App *)__gnu_cxx::
                     __normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
                     ::operator*(&__end2_1);
        std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)com);
        uVar9 = ::std::__cxx11::string::empty();
        if (((uVar9 & 1) != 0) &&
           (peVar7 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)com), (peVar7->disabled_ & 1U) == 0)) {
          peVar7 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)com);
          bVar1 = _parse_positional(peVar7,args,false);
          if (bVar1) {
            peVar7 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)com);
            if ((peVar7->pre_parse_called_ & 1U) == 0) {
              peVar7 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)com);
              sVar4 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::size(args);
              _trigger_pre_parse(peVar7,sVar4);
            }
            return true;
          }
        }
        __gnu_cxx::
        __normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
        ::operator++(&__end2_1);
      } while( true );
    }
    pos_1.field_2._8_8_ =
         __gnu_cxx::
         __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
         ::operator*(&__end2);
    pOVar6 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                       ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
                        pos_1.field_2._8_8_);
    bVar1 = Option::get_positional(pOVar6);
    if (bVar1) {
      pOVar6 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                         ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
                          pos_1.field_2._8_8_);
      sVar5 = Option::count(pOVar6);
      pOVar6 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                         ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
                          pos_1.field_2._8_8_);
      iVar2 = Option::get_items_expected_min(pOVar6);
      if (iVar2 <= (int)sVar5) {
        pOVar6 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                           ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
                            pos_1.field_2._8_8_);
        bVar1 = Option::get_allow_extra_args(pOVar6);
        if (!bVar1) goto LAB_0018f41d;
      }
      if ((this->validate_positionals_ & 1U) == 0) {
LAB_0018f361:
        pOVar6 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                           ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
                            pos_1.field_2._8_8_);
        ::std::__cxx11::string::string((string *)&local_158,(string *)pvVar3);
        Option::add_result(pOVar6,&local_158);
        ::std::__cxx11::string::~string((string *)&local_158);
        __range2_1 = (vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                      *)std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::get
                                  ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
                                   pos_1.field_2._8_8_);
        std::vector<CLI::Option_*,_std::allocator<CLI::Option_*>_>::push_back
                  (&this->parse_order_,(value_type *)&__range2_1);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::pop_back(args);
        return true;
      }
      ::std::__cxx11::string::string((string *)local_118,(string *)pvVar3);
      pOVar6 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                         ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
                          pos_1.field_2._8_8_);
      Option::_validate(&local_138,pOVar6,(string *)local_118,0);
      ::std::__cxx11::string::operator=((string *)local_118,(string *)&local_138);
      ::std::__cxx11::string::~string((string *)&local_138);
      uVar9 = ::std::__cxx11::string::empty();
      if ((uVar9 & 1) == 0) {
        local_b0 = 5;
      }
      else {
        local_b0 = 0;
      }
      ::std::__cxx11::string::~string((string *)local_118);
      if (local_b0 == 0) goto LAB_0018f361;
    }
LAB_0018f41d:
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

bool _parse_positional(std::vector<std::string> &args, bool haltOnSubcommand) {

        const std::string &positional = args.back();

        if(positionals_at_end_) {
            // deal with the case of required arguments at the end which should take precedence over other arguments
            auto arg_rem = args.size();
            auto remreq = _count_remaining_positionals(true);
            if(arg_rem <= remreq) {
                for(const Option_p &opt : options_) {
                    if(opt->get_positional() && opt->required_) {
                        if(static_cast<int>(opt->count()) < opt->get_items_expected_min()) {
                            if(validate_positionals_) {
                                std::string pos = positional;
                                pos = opt->_validate(pos, 0);
                                if(!pos.empty()) {
                                    continue;
                                }
                            }
                            opt->add_result(positional);
                            parse_order_.push_back(opt.get());
                            args.pop_back();
                            return true;
                        }
                    }
                }
            }
        }
        for(const Option_p &opt : options_) {
            // Eat options, one by one, until done
            if(opt->get_positional() &&
               (static_cast<int>(opt->count()) < opt->get_items_expected_min() || opt->get_allow_extra_args())) {
                if(validate_positionals_) {
                    std::string pos = positional;
                    pos = opt->_validate(pos, 0);
                    if(!pos.empty()) {
                        continue;
                    }
                }
                opt->add_result(positional);
                parse_order_.push_back(opt.get());
                args.pop_back();
                return true;
            }
        }

        for(auto &subc : subcommands_) {
            if((subc->name_.empty()) && (!subc->disabled_)) {
                if(subc->_parse_positional(args, false)) {
                    if(!subc->pre_parse_called_) {
                        subc->_trigger_pre_parse(args.size());
                    }
                    return true;
                }
            }
        }
        // let the parent deal with it if possible
        if(parent_ != nullptr && fallthrough_)
            return _get_fallthrough_parent()->_parse_positional(args, static_cast<bool>(parse_complete_callback_));

        /// Try to find a local subcommand that is repeated
        auto com = _find_subcommand(args.back(), true, false);
        if(com != nullptr && (require_subcommand_max_ == 0 || require_subcommand_max_ > parsed_subcommands_.size())) {
            if(haltOnSubcommand) {
                return false;
            }
            args.pop_back();
            com->_parse(args);
            return true;
        }
        /// now try one last gasp at subcommands that have been executed before, go to root app and try to find a
        /// subcommand in a broader way, if one exists let the parent deal with it
        auto parent_app = (parent_ != nullptr) ? _get_fallthrough_parent() : this;
        com = parent_app->_find_subcommand(args.back(), true, false);
        if(com != nullptr && (com->parent_->require_subcommand_max_ == 0 ||
                              com->parent_->require_subcommand_max_ > com->parent_->parsed_subcommands_.size())) {
            return false;
        }

        if(positionals_at_end_) {
            throw CLI::ExtrasError(name_, args);
        }
        /// If this is an option group don't deal with it
        if(parent_ != nullptr && name_.empty()) {
            return false;
        }
        /// We are out of other options this goes to missing
        _move_to_missing(detail::Classifier::NONE, positional);
        args.pop_back();
        if(prefix_command_) {
            while(!args.empty()) {
                _move_to_missing(detail::Classifier::NONE, args.back());
                args.pop_back();
            }
        }

        return true;
    }